

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

int __thiscall glslang::TScanContext::precisionKeyword(TScanContext *this)

{
  bool bVar1;
  TScanContext *this_local;
  
  bVar1 = TParseVersions::isEsProfile(&this->parseContext->super_TParseVersions);
  if ((bVar1) || (0x81 < (this->parseContext->super_TParseVersions).version)) {
    this_local._4_4_ = this->keyword;
  }
  else {
    bVar1 = TParseVersions::isForwardCompatible(&this->parseContext->super_TParseVersions);
    if (bVar1) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2e])
                (this->parseContext,&this->loc,"using ES precision qualifier keyword",
                 this->tokenText,"");
    }
    this_local._4_4_ = identifierOrType(this);
  }
  return this_local._4_4_;
}

Assistant:

int TScanContext::precisionKeyword()
{
    if (parseContext.isEsProfile() || parseContext.version >= 130)
        return keyword;

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using ES precision qualifier keyword", tokenText, "");

    return identifierOrType();
}